

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::Enum>
reflection::CreateEnum
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_>
          values,bool is_union,Offset<reflection::Type> underlying_type,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Enum> OVar1;
  undefined1 local_48 [8];
  EnumBuilder builder_;
  bool is_union_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::String> declaration_file_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  documentation_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
  attributes_local;
  Offset<reflection::Type> underlying_type_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> values_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._15_1_ = is_union;
  EnumBuilder::EnumBuilder((EnumBuilder *)local_48,_fbb);
  EnumBuilder::add_declaration_file((EnumBuilder *)local_48,declaration_file);
  EnumBuilder::add_documentation((EnumBuilder *)local_48,documentation);
  EnumBuilder::add_attributes((EnumBuilder *)local_48,attributes);
  EnumBuilder::add_underlying_type((EnumBuilder *)local_48,underlying_type);
  EnumBuilder::add_values((EnumBuilder *)local_48,values);
  EnumBuilder::add_name((EnumBuilder *)local_48,name);
  EnumBuilder::add_is_union((EnumBuilder *)local_48,(bool)(builder_._15_1_ & 1));
  OVar1 = EnumBuilder::Finish((EnumBuilder *)local_48);
  return (Offset<reflection::Enum>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Enum> CreateEnum(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::EnumVal>>> values = 0,
    bool is_union = false,
    ::flatbuffers::Offset<reflection::Type> underlying_type = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  EnumBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_underlying_type(underlying_type);
  builder_.add_values(values);
  builder_.add_name(name);
  builder_.add_is_union(is_union);
  return builder_.Finish();
}